

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psvimg-create.c
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  char *pcVar2;
  int iVar3;
  time_t tVar4;
  ulong uVar5;
  int i;
  long lVar6;
  int fds [4];
  pthread_t pth2;
  pthread_t pth1;
  args_t args1;
  args_t args2;
  PsvMd_t md;
  stat st;
  char path [1024];
  int local_628;
  int local_624;
  int local_620;
  undefined4 local_61c;
  pthread_t local_618;
  pthread_t local_610;
  int local_608;
  int local_604;
  char *local_5d0;
  undefined8 local_5c8;
  int local_5c0;
  int local_5bc;
  uint8_t local_5b8 [32];
  undefined8 local_598;
  undefined8 uStack_590;
  int local_574;
  int local_570;
  char local_554 [64];
  __off_t local_514;
  undefined8 local_50c;
  undefined8 local_504;
  undefined8 local_4fc;
  undefined8 uStack_4f4;
  undefined4 local_4cc;
  stat local_4c8;
  char local_438 [1032];
  
  if (argc < 7) {
    main_cold_16();
    return 1;
  }
  pcVar2 = argv[1];
  if (*pcVar2 != '-') {
LAB_0010286c:
    main_cold_1();
    return 1;
  }
  if ((pcVar2[1] == 'm') && (pcVar2[2] == '\0')) {
    iVar3 = open(argv[2],0);
    if (iVar3 < 0) {
      main_cold_15();
      return 1;
    }
    uVar5 = read_block(iVar3,&local_574,0xa8);
    if (uVar5 < 0xa8) {
      main_cold_14();
      return 1;
    }
    if (local_570 != 2) {
      main_cold_2();
      return 1;
    }
    uVar5 = read_block(iVar3,&local_4cc,4);
    if (uVar5 < 4) {
      main_cold_13();
      return 1;
    }
    close(iVar3);
  }
  else {
    if ((pcVar2[1] != 'n') || (pcVar2[2] != '\0')) goto LAB_0010286c;
    lVar6 = 0;
    memset(&local_574,0,0xac);
    strncpy(local_554,argv[2],0x40);
    iVar3 = is_backup(local_554);
    local_574 = -0x11e6ff2 - (uint)(iVar3 == 0);
    local_570 = 2;
    local_50c = 2;
    local_4cc = 1;
    tVar4 = time((time_t *)0x0);
    srand((uint)tVar4);
    do {
      iVar3 = rand();
      *(char *)((long)&local_4fc + lVar6) =
           ((char)(uint)((ulong)((long)iVar3 * 0x80808081) >> 0x27) -
           (char)((long)iVar3 * 0x80808081 >> 0x3f)) + (char)iVar3;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
  }
  iVar3 = pipe(&local_628);
  if (iVar3 < 0) {
    main_cold_12();
    return 1;
  }
  local_608 = 0;
  local_5d0 = argv[5];
  local_5c8 = 0;
  local_604 = local_624;
  ppcVar1 = argv + 6;
  iVar3 = stat(argv[6],&local_4c8);
  if (iVar3 < 0) {
    mkdir(*ppcVar1,0x1c0);
  }
  snprintf(local_438,0x400,"%s/%s.psvimg",*ppcVar1,local_554);
  local_5bc = open(local_438,0x241,0x1a4);
  if (local_5bc < 0) {
    main_cold_11();
    return 1;
  }
  local_5c0 = local_628;
  pcVar2 = argv[3];
  if (*pcVar2 == '-') {
    if ((pcVar2[1] == 'K') && (pcVar2[2] == '\0')) {
      iVar3 = parse_key(argv[4],local_5b8);
      if (iVar3 < 0) {
        main_cold_10();
        return 1;
      }
    }
    else {
      if ((pcVar2[1] != 'A') || (pcVar2[2] != '\0')) goto LAB_001029ef;
      iVar3 = generate_key_from_aid(argv[4],local_5b8);
      if (iVar3 < 0) {
        main_cold_4();
        return 1;
      }
    }
    local_598 = local_4fc;
    uStack_590 = uStack_4f4;
    pthread_create(&local_610,(pthread_attr_t *)0x0,encrypt_thread,&local_5c0);
    pthread_create(&local_618,(pthread_attr_t *)0x0,pack_thread,&local_608);
    pthread_join(local_618,(void **)0x0);
    pthread_join(local_610,(void **)0x0);
    iVar3 = stat(local_438,&local_4c8);
    if (iVar3 < 0) {
      main_cold_9();
    }
    else {
      fprintf(_stderr,"created %s (size: %llx, content size: %zx)\n",local_438,local_4c8.st_size,
              local_5c8);
      local_504 = local_5c8;
      local_514 = local_4c8.st_size;
      snprintf(local_438,0x400,"%s/%s.psvmd",*ppcVar1,local_554);
      iVar3 = pipe(&local_628);
      if (iVar3 < 0) {
        main_cold_8();
      }
      else {
        iVar3 = pipe(&local_620);
        if (iVar3 < 0) {
          main_cold_7();
        }
        else {
          local_608 = local_628;
          local_604 = local_61c;
          local_5c0 = local_620;
          local_5bc = open(local_438,0x241,0x1a4);
          if (-1 < local_5bc) {
            lVar6 = 0x28;
            do {
              iVar3 = rand();
              *(char *)((long)&local_5c0 + lVar6) =
                   ((char)(uint)((ulong)((long)iVar3 * 0x80808081) >> 0x27) -
                   (char)((long)iVar3 * 0x80808081 >> 0x3f)) + (char)iVar3;
              lVar6 = lVar6 + 1;
            } while (lVar6 != 0x38);
            pthread_create(&local_610,(pthread_attr_t *)0x0,encrypt_thread,&local_5c0);
            pthread_create(&local_618,(pthread_attr_t *)0x0,compress_thread,&local_608);
            write_block(local_624,&local_574,0xac);
            close(local_624);
            pthread_join(local_618,(void **)0x0);
            pthread_join(local_610,(void **)0x0);
            fprintf(_stderr,"created %s\n",local_438);
            iVar3 = is_backup(local_554);
            if (iVar3 != 0) {
              main_cold_5();
              return 0;
            }
            return 0;
          }
          main_cold_6();
        }
      }
    }
  }
  else {
LAB_001029ef:
    main_cold_3();
  }
  return 1;
}

Assistant:

int main(int argc, const char *argv[]) {
  args_t args1, args2;
  struct stat st;
  int fds[4];
  char path[MAX_PATH_LEN];
  int mfd;
  PsvMd_t md;
  pthread_t pth1, pth2;

  if (argc < 7) {
    fprintf(stderr, "usage: psvimg-create [-m metadata|-n name] [-A aid | -K key] inputdir outputdir\n");
    fprintf(stderr, "  specify either a decrypted metadata file as a template or\n");
    fprintf(stderr, "  a name and other metadata fields will retain default values\n");
    return 1;
  }

  // TODO: support more types
  if (strcmp(argv[1], "-m") == 0) {
    mfd = open(argv[2], O_RDONLY | O_BINARY);
    if (mfd < 0) {
      fprintf(stderr, "metadata\n");
      return 1;
    }
    if (read_block(mfd, &md, sizeof(md) - sizeof(md.add_data)) < sizeof(md) - sizeof(md.add_data)) {
      fprintf(stderr, "invalid metadata size\n");
      return 1;
    }
    if (md.type != 2) {
      fprintf(stderr, "metadata type not supported\n");
      close(mfd);
      return 1;
    }
    if (read_block(mfd, &md.add_data, sizeof(md.add_data)) < sizeof(md.add_data)) {
      fprintf(stderr, "invalid metadata size\n");
      close(mfd);
      return 1;
    }
    close(mfd);
  } else if (strcmp(argv[1], "-n") == 0) {
    memset(&md, 0, sizeof(md));
    strncpy(md.name, argv[2], sizeof(md.name));
    md.magic = is_backup(md.name) ? PSVMD_BACKUP_MAGIC : PSVMD_CONTENT_MAGIC;
    md.type = 2;
    md.version = 2;
    md.add_data = 1;
    srand(time(NULL));
    for (int i = 0; i < sizeof(md.iv); i++) {
      md.iv[i] = rand() % 0xFF;
    }
  } else {
    fprintf(stderr, "you must specify either -m or -n!\n");
    return 1;
  }

  if (pipe(fds) < 0) {
    fprintf(stderr, "pipe 1\n");
    return 1;
  }

  args1.in = 0;
  args1.prefix = argv[5];
  args1.content_size = 0;
  args1.out = fds[1];

  if (stat(argv[6], &st) < 0) {
    mkdir(argv[6], 0700);
  }

  snprintf(path, sizeof(path), "%s/%s.psvimg", argv[6], md.name);

  args2.out = open(path, O_WRONLY | O_CREAT | O_BINARY | O_TRUNC, 0644);
  if (args2.out < 0) {
    fprintf(stderr, "psvimg output\n");
    return 1;
  }
  args2.in = fds[0];

  if (strcmp(argv[3], "-K") == 0) {
    if (parse_key(argv[4], args2.key) < 0) {
      fprintf(stderr, "invalid key\n");
      return 1;
    }
  } else if (strcmp(argv[3], "-A") == 0) {
    if (generate_key_from_aid(argv[4], args2.key) < 0) {
      fprintf(stderr, "invalid aid\n");
      return 1;
    }
  } else {
    fprintf(stderr, "you must specify either -A or -K!\n");
    return 1;
  }

  memcpy(args2.iv, md.iv, sizeof(args2.iv));

  pthread_create(&pth1, NULL, encrypt_thread, &args2);
  pthread_create(&pth2, NULL, pack_thread, &args1);

  pthread_join(pth2, NULL);
  pthread_join(pth1, NULL);

  if (stat(path, &st) < 0) {
    fprintf(stderr, "stat\n");
    return 1;
  }
  fprintf(stderr, "created %s (size: %llx, content size: %zx)\n", path, st.st_size, args1.content_size);
  md.total_size = args1.content_size;
  md.psvimg_size = st.st_size;

  // now create the psvmd
  snprintf(path, sizeof(path), "%s/%s.psvmd", argv[6], md.name);

  if (pipe(fds) < 0) {
    fprintf(stderr, "pipe 2\n");
    return 1;
  }
  if (pipe(&fds[2]) < 0) {
    fprintf(stderr, "pipe 3\n");
    return 1;
  }

  args1.in = fds[0];
  args1.out = fds[3];

  args2.in = fds[2];
  args2.out = open(path, O_WRONLY | O_CREAT | O_BINARY | O_TRUNC, 0644);
  if (args2.out < 0) {
    fprintf(stderr, "psvmd output\n");
    return 1;
  }
  for (int i = 0; i < sizeof(md.iv); i++) {
    args2.iv[i] = rand() % 0xFF;
  }

  pthread_create(&pth1, NULL, encrypt_thread, &args2);
  pthread_create(&pth2, NULL, compress_thread, &args1);
  write_block(fds[1], &md, sizeof(md));
  close(fds[1]);

  pthread_join(pth2, NULL);
  pthread_join(pth1, NULL);

  
  fprintf(stderr, "created %s\n", path);

  // finally create the psvinf
  if (is_backup(md.name)) {
    snprintf(path, sizeof(path), "%s/%s.psvinf", argv[6], md.name);
    mfd = open(path, O_WRONLY | O_CREAT | O_BINARY | O_TRUNC, 0644);
    write_block(mfd, md.name, strnlen(md.name, 64) + 1);
    close(mfd);
    fprintf(stderr, "created %s\n", path);
  }

  return 0;
}